

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void lest::report(ostream *os,message *e,text *test)

{
  ostream *poVar1;
  char *pcVar2;
  string *in_RDX;
  long *in_RSI;
  location *in_stack_fffffffffffffe78;
  location *in_stack_fffffffffffffe80;
  allocator local_111;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [16];
  comment *in_stack_ffffffffffffff40;
  ostream *in_stack_ffffffffffffff48;
  string local_90 [32];
  string local_70 [96];
  long *local_10;
  
  local_10 = in_RSI;
  location::location(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  poVar1 = operator<<((ostream *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::string::string(local_90,(string *)(local_10 + 2));
  colourise(&in_stack_fffffffffffffe78->file);
  std::operator<<(poVar1,local_70);
  comment::comment((comment *)in_stack_fffffffffffffe80,(comment *)in_stack_fffffffffffffe78);
  poVar1 = operator<<(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = (char *)(**(code **)(*local_10 + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,pcVar2,&local_111);
  std::__cxx11::string::string(local_f0,local_110);
  colourise(&in_stack_fffffffffffffe78->file);
  poVar1 = std::operator<<(poVar1,local_d0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  comment::~comment((comment *)0x112805);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  location::~location((location *)0x112832);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}